

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_RegexTests_Test::TestSuite_RegexTests_Test(TestSuite_RegexTests_Test *this)

{
  TestSuite_RegexTests_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestSuite_RegexTests_Test_00285280;
  return;
}

Assistant:

TEST(TestSuite, RegexTests) {

  // greedy match, repeats [a-z] 4 times
  PrintMatches("abcdefghi", "a[a-z]{2,4}");

  // non-greedy match, repeats [a-z] 2 times
  PrintMatches("abcdefghi", "a[a-z]{2,4}?");

  // Choice point ordering for quantifiers results in a match
  // with two repetitions, first matching the substring "aa",
  // second matching the substring "ba", leaving "ac" not matched
  // ("ba" appears in the capture clause m[1])
  PrintMatches("aabaac", "(aa|aabaac|ba|b|c)*");

  // Choice point ordering for quantifiers makes this regex
  // calculate the greatest common divisor between 10 and 15
  // (the answer is 5, and it populates m[1] with "aaaaa")
  PrintMatches("aaaaaaaaaa,aaaaaaaaaaaaaaa", "^(a+)\\1*,\\1+$");

  // the substring "bbb" does not appear in the capture clause m[4]
  // because it is cleared when the second repetition of the atom
  // (a+)?(b+)?(c) is matching the substring "ac"
  PrintMatches("zaacbbbcac", "(z)((a+)?(b+)?(c))*");

}